

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

ParamGenerator<unsigned_int_(*)(const_short_*)> __thiscall
testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ParamGenerator<unsigned_int_(*)(const_short_*)> PVar1;
  _Vector_base<unsigned_int_(*)(const_short_*),_std::allocator<unsigned_int_(*)(const_short_*)>_>
  _Stack_28;
  
  ValueArray<unsigned_int(*)(short_const*)>::MakeVector<unsigned_int(*)(short_const*),0ul>
            (&_Stack_28);
  ValuesIn<std::vector<unsigned_int(*)(short_const*),std::allocator<unsigned_int(*)(short_const*)>>>
            ((testing *)this,
             (vector<unsigned_int_(*)(const_short_*),_std::allocator<unsigned_int_(*)(const_short_*)>_>
              *)&_Stack_28);
  std::
  _Vector_base<unsigned_int_(*)(const_short_*),_std::allocator<unsigned_int_(*)(const_short_*)>_>::
  ~_Vector_base(&_Stack_28);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<unsigned_int_(*)(const_short_*)>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<unsigned_int_(*)(const_short_*)>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<unsigned_int_(*)(const_short_*)>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<unsigned_int_(*)(const_short_*)>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }